

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

uint __thiscall Assimp::FBX::FBXConverter::GetDefaultMaterial(FBXConverter *this)

{
  pointer *pppaVar1;
  iterator __position;
  uint uVar2;
  aiMaterial *this_00;
  aiMaterial *out_mat;
  aiColor3D diffuse;
  aiString s;
  aiMaterial *local_430;
  undefined8 local_428;
  undefined4 local_420;
  aiString local_41c;
  
  uVar2 = this->defaultMaterialIndex;
  if (uVar2 == 0) {
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    __position._M_current =
         (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_430 = this_00;
    if (__position._M_current ==
        (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
                ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&this->materials,__position,
                 &local_430);
    }
    else {
      *__position._M_current = this_00;
      pppaVar1 = &(this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppaVar1 = *pppaVar1 + 1;
    }
    local_428 = 0x3f4ccccd3f4ccccd;
    local_420 = 0x3f4ccccd;
    aiMaterial::AddBinaryProperty(local_430,&local_428,0xc,"$clr.diffuse",0,0,aiPTI_Float);
    local_41c.length = 0;
    local_41c.data[0] = '\0';
    memset(local_41c.data + 1,0x1b,0x3ff);
    local_41c.length = 0xf;
    builtin_strncpy(local_41c.data,"DefaultMaterial",0x10);
    aiMaterial::AddProperty(local_430,&local_41c,"?mat.name",0,0);
    uVar2 = (uint)((ulong)((long)(this->materials).
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->materials).
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    this->defaultMaterialIndex = uVar2;
  }
  return uVar2 - 1;
}

Assistant:

unsigned int FBXConverter::GetDefaultMaterial()
        {
            if (defaultMaterialIndex) {
                return defaultMaterialIndex - 1;
            }

            aiMaterial* out_mat = new aiMaterial();
            materials.push_back(out_mat);

            const aiColor3D diffuse = aiColor3D(0.8f, 0.8f, 0.8f);
            out_mat->AddProperty(&diffuse, 1, AI_MATKEY_COLOR_DIFFUSE);

            aiString s;
            s.Set(AI_DEFAULT_MATERIAL_NAME);

            out_mat->AddProperty(&s, AI_MATKEY_NAME);

            defaultMaterialIndex = static_cast<unsigned int>(materials.size());
            return defaultMaterialIndex - 1;
        }